

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchMusic(int dummy)

{
  int iVar1;
  FString *this;
  char *pcVar2;
  FString local_20;
  FString keystring;
  char *newname;
  int result;
  int dummy_local;
  
  DPrintf(4,"[Music]\n");
  while( true ) {
    iVar1 = GetLine();
    if (iVar1 != 1) break;
    keystring.Chars = skipwhite(Line2);
    FString::FString(&local_20);
    this = FString::operator<<(&local_20,"MUSIC_");
    FString::operator<<(this,Line1);
    pcVar2 = FString::operator_cast_to_char_(&local_20);
    FStringTable::SetString(&GStrings,pcVar2,keystring.Chars);
    pcVar2 = FString::GetChars(&local_20);
    DPrintf(4,"Music %s set to:\n%s\n",pcVar2,keystring.Chars);
    FString::~FString(&local_20);
  }
  return iVar1;
}

Assistant:

static int PatchMusic (int dummy)
{
	int result;

	DPrintf (DMSG_SPAMMY, "[Music]\n");

	while ((result = GetLine()) == 1)
	{
		const char *newname = skipwhite (Line2);
		FString keystring;
		
		keystring << "MUSIC_" << Line1;

		GStrings.SetString (keystring, newname);
		DPrintf (DMSG_SPAMMY, "Music %s set to:\n%s\n", keystring.GetChars(), newname);
	}

	return result;
}